

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O3

ImGuiContext * ImGui_Init(SDL_Window *window,SDL_GLContext gl_context)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  
  if (ImGui_Init(SDL_Window*,void*)::isInitialized == '\0') {
    iVar3 = gl3wInit();
    if (iVar3 != 0) {
      ImGui_Init();
      return (ImGuiContext *)0x0;
    }
    ImGui_Init(SDL_Window*,void*)::isInitialized = '\x01';
  }
  ImGui::DebugCheckVersionAndDataLayout("1.80 WIP",0x1558,0x3bc,8,0x10,0x14,2);
  pIVar4 = (ImGuiContext *)ImGui::CreateContext((ImFontAtlas *)0x0);
  ImGui::SetCurrentContext(pIVar4);
  ImGui::GetIO();
  bVar1 = ImGui_ImplSDL2_InitForOpenGL(window,gl_context);
  bVar2 = ImGui_ImplOpenGL3_Init("#version 130");
  if (!bVar2) {
    pIVar4 = (ImGuiContext *)0x0;
  }
  if (!bVar1) {
    pIVar4 = (ImGuiContext *)0x0;
  }
  return pIVar4;
}

Assistant:

ImGuiContext* ImGui_Init(SDL_Window* window, SDL_GLContext gl_context) {
    // Decide GL+GLSL versions
#if __APPLE__
    // GL 3.2 Core + GLSL 150
    const char* glsl_version = "#version 150";
#elif __EMSCRIPTEN__
    const char* glsl_version = "#version 100";
#else
    // GL 3.0 + GLSL 130
    const char* glsl_version = "#version 130";
#endif

    static bool isInitialized = false;
    if (!isInitialized) {
        // Initialize OpenGL loader
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
        bool err = gl3wInit() != 0;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
        bool err = glewInit() != GLEW_OK;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
        bool err = gladLoadGL() == 0;
#else
        bool err = false; // If you use IMGUI_IMPL_OPENGL_LOADER_CUSTOM, your loader is likely to requires some form of initialization.
#endif

        if (err) {
            fprintf(stderr, "Failed to initialize OpenGL loader!\n");
            return nullptr;
        }
        isInitialized = true;
    }

    // Setup Dear ImGui context
    IMGUI_CHECKVERSION();
    auto ctx = ImGui::CreateContext();
    ImGui::SetCurrentContext(ctx);

    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableGamepad;   // Enable Gamepad Controls

    // Setup Platform/Renderer bindings
    bool res = true;
    res &= ImGui_ImplSDL2_InitForOpenGL(window, gl_context);
    res &= ImGui_ImplOpenGL3_Init(glsl_version);

    return res ? ctx : nullptr;
}